

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

int64_t cpu_get_ticks_mipsel(void)

{
  int64_t iVar1;
  
  iVar1 = rdtsc();
  return iVar1;
}

Assistant:

static inline int64_t cpu_get_host_ticks(void)
{
#ifdef _MSC_VER
    return __rdtsc();
#else
    uint32_t low,high;
    int64_t val;
    asm volatile("rdtsc" : "=a" (low), "=d" (high));
    val = high;
    val <<= 32;
    val |= low;
    return val;
#endif
}